

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O2

char * cft_args_get_autotune_metric_label(fasttext_args_t *handle)

{
  char *pcVar1;
  string local_30;
  
  fasttext::Args::getAutotuneMetricLabel_abi_cxx11_(&local_30,(Args *)handle);
  pcVar1 = strdup(local_30._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_30);
  return pcVar1;
}

Assistant:

const char* cft_args_get_autotune_metric_label(fasttext_args_t *handle) {
    return strdup(((Args*)handle)->getAutotuneMetricLabel().c_str());
}